

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbol(DescriptorBuilder *this,string *name,bool build_it)

{
  bool bVar1;
  Type TVar2;
  string *package_name;
  size_type sVar3;
  iterator this_00;
  reference ppFVar4;
  string *in_RSI;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *in_RDI;
  Symbol SVar5;
  const_iterator it;
  FileDescriptor *file;
  Symbol result;
  _Self in_stack_ffffffffffffffb0;
  _Self in_stack_ffffffffffffffb8;
  DescriptorBuilder *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffcc;
  ulong local_10;
  anon_union_8_8_13f84498_for_Symbol_2 local_8;
  
  SVar5 = FindSymbolNotEnforcingDeps
                    (in_stack_ffffffffffffffc0,(string *)in_stack_ffffffffffffffb8._M_node,
                     SUB81((ulong)in_stack_ffffffffffffffb0._M_node >> 0x38,0));
  local_8 = SVar5.field_1;
  TVar2 = SVar5.type;
  bVar1 = Symbol::IsNull((Symbol *)&stack0xffffffffffffffc8);
  if (bVar1) {
    local_10 = CONCAT44(in_stack_ffffffffffffffcc,TVar2);
  }
  else if ((*(byte *)(*(long *)&(in_RDI->_M_t)._M_impl + 0x28) & 1) == 0) {
    local_10 = CONCAT44(in_stack_ffffffffffffffcc,TVar2);
  }
  else {
    package_name = (string *)Symbol::GetFile((Symbol *)in_stack_ffffffffffffffb8._M_node);
    if ((package_name == (string *)in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_node_count) ||
       (sVar3 = std::
                set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::count((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                         *)package_name,(key_type *)in_stack_ffffffffffffffb8._M_node), sVar3 != 0))
    {
      local_10 = (ulong)TVar2;
    }
    else {
      if (TVar2 == PACKAGE) {
        bVar1 = IsInPackage((DescriptorBuilder *)local_8.descriptor,
                            (FileDescriptor *)CONCAT44(in_stack_ffffffffffffffcc,8),package_name);
        if (bVar1) {
          local_10 = CONCAT44(in_stack_ffffffffffffffcc,TVar2);
          goto LAB_004b7cde;
        }
        std::
        set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ::begin(in_RDI);
        while( true ) {
          this_00 = std::
                    set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    ::end(in_RDI);
          bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffb8,
                                  (_Self *)&stack0xffffffffffffffb0);
          if (!bVar1) break;
          ppFVar4 = std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>::
                    operator*((_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*> *)
                              0x4b7c58);
          if (*ppFVar4 != (FileDescriptor *)0x0) {
            std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>::operator*
                      ((_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*> *)0x4b7c68
                      );
            bVar1 = IsInPackage((DescriptorBuilder *)local_8.descriptor,
                                (FileDescriptor *)CONCAT44(in_stack_ffffffffffffffcc,TVar2),
                                package_name);
            if (bVar1) {
              local_10 = CONCAT44(in_stack_ffffffffffffffcc,TVar2);
              goto LAB_004b7cde;
            }
          }
          std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>::operator++
                    ((_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*> *)
                     this_00._M_node);
        }
      }
      *(string **)&in_RDI[4]._M_t._M_impl.super__Rb_tree_header._M_header = package_name;
      std::__cxx11::string::operator=
                ((string *)&in_RDI[4]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,in_RSI)
      ;
      local_10 = (anonymous_namespace)::kNullSymbol;
      local_8 = DAT_00ad9958;
    }
  }
LAB_004b7cde:
  SVar5._0_8_ = local_10 & 0xffffffff;
  SVar5.field_1.descriptor = local_8.descriptor;
  return SVar5;
}

Assistant:

Symbol DescriptorBuilder::FindSymbol(const std::string& name, bool build_it) {
  Symbol result = FindSymbolNotEnforcingDeps(name, build_it);

  if (result.IsNull()) return result;

  if (!pool_->enforce_dependencies_) {
    // Hack for CompilerUpgrader, and also used for lazily_build_dependencies_
    return result;
  }

  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) {
    return result;
  }

  if (result.type == Symbol::PACKAGE) {
    // Arg, this is overcomplicated.  The symbol is a package name.  It could
    // be that the package was defined in multiple files.  result.GetFile()
    // returns the first file we saw that used this package.  We've determined
    // that that file is not a direct dependency of the file we are currently
    // building, but it could be that some other file which *is* a direct
    // dependency also defines the same package.  We can't really rule out this
    // symbol unless none of the dependencies define it.
    if (IsInPackage(file_, name)) return result;
    for (std::set<const FileDescriptor*>::const_iterator it =
             dependencies_.begin();
         it != dependencies_.end(); ++it) {
      // Note:  A dependency may be nullptr if it was not found or had errors.
      if (*it != nullptr && IsInPackage(*it, name)) return result;
    }
  }

  possible_undeclared_dependency_ = file;
  possible_undeclared_dependency_name_ = name;
  return kNullSymbol;
}